

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O1

int __thiscall
Centaurus::CATNMachine<char>::add_node
          (CATNMachine<char> *this,CATNNode<char> *node,int origin,int tag)

{
  pointer pCVar1;
  pointer pCVar2;
  bool local_49;
  int local_48;
  int local_44;
  CharClass<char> local_40;
  
  pCVar1 = (this->m_nodes).
           super__Vector_base<Centaurus::CATNNode<char>,_std::allocator<Centaurus::CATNNode<char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar2 = (this->m_nodes).
           super__Vector_base<Centaurus::CATNNode<char>,_std::allocator<Centaurus::CATNNode<char>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (-1 < origin && pCVar1 != pCVar2) {
    local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_001a7030;
    local_40.m_ranges.
    super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_40.m_ranges.
    super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_40.m_ranges.
    super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_44 = (int)((ulong)((long)pCVar2 - (long)pCVar1) >> 4) * -0x33333333;
    local_49 = false;
    local_48 = tag;
    std::vector<Centaurus::NFATransition<char>,std::allocator<Centaurus::NFATransition<char>>>::
    emplace_back<Centaurus::CharClass<char>const&,int&,bool,int&>
              ((vector<Centaurus::NFATransition<char>,std::allocator<Centaurus::NFATransition<char>>>
                *)&pCVar1[(uint)origin].m_transitions,&local_40,&local_44,&local_49,&local_48);
    local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_001a7030;
    std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::~vector
              (&local_40.m_ranges);
  }
  std::vector<Centaurus::CATNNode<char>,_std::allocator<Centaurus::CATNNode<char>_>_>::push_back
            (&this->m_nodes,node);
  return (int)((ulong)((long)(this->m_nodes).
                             super__Vector_base<Centaurus::CATNNode<char>,_std::allocator<Centaurus::CATNNode<char>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_nodes).
                            super__Vector_base<Centaurus::CATNNode<char>,_std::allocator<Centaurus::CATNNode<char>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333 + -1;
}

Assistant:

int add_node(const CATNNode<TCHAR>& node, int origin, int tag)
    {
        if (!m_nodes.empty() && origin >= 0)
            m_nodes[origin].add_transition(CharClass<TCHAR>(), m_nodes.size(), tag);
        m_nodes.push_back(node);
        return m_nodes.size() - 1;
    }